

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall
ON_Mesh::GetCurvatureStats(ON_Mesh *this,curvature_style kappa_style,ON_MeshCurvatureStats *stats)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  ON_MeshCurvatureStats *pOVar4;
  ON_3fVector *in_R8;
  
  ON_MeshCurvatureStats::Destroy(stats);
  uVar1 = kappa_style - gaussian_curvature;
  if (uVar1 < 4) {
    iVar2 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    if (iVar2 < 1) {
      return false;
    }
    if ((this->m_K).m_count != iVar2) {
      return false;
    }
    pOVar4 = this->m_kstat[uVar1];
    if (pOVar4 == (ON_MeshCurvatureStats *)0x0) {
      pOVar4 = (ON_MeshCurvatureStats *)operator_new(0x40);
      ON_MeshCurvatureStats::ON_MeshCurvatureStats(pOVar4);
      this->m_kstat[uVar1] = pOVar4;
      ON_MeshCurvatureStats::Set(pOVar4,kappa_style,(this->m_K).m_count,(this->m_K).m_a,in_R8,0.0);
      pOVar4 = this->m_kstat[uVar1];
      if (pOVar4 == (ON_MeshCurvatureStats *)0x0) goto LAB_005192f8;
    }
    ON_MeshCurvatureStats::operator=(stats,pOVar4);
    bVar3 = true;
  }
  else {
LAB_005192f8:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ON_Mesh::GetCurvatureStats( // returns true if successful
       ON::curvature_style kappa_style,
       ON_MeshCurvatureStats& stats
       ) const
{
  bool rc = false;
  stats.Destroy();
  int ksi;
  switch ( kappa_style ) {
    case ON::gaussian_curvature:
      ksi = 0;
      break;
    case ON::mean_curvature:
      ksi = 1;
      break;
    case ON::min_curvature: // minimum unsigned radius of curvature
      ksi = 2;
      break;
    case ON::max_curvature: // maximum unsigned radius of curvature
      ksi = 3;
      break;
    //case ON::section_curvature_x:
    //  ksi = 4;
    //  break;
    //case ON::section_curvature_y:
    //  ksi = 5;
    //  break;
    //case ON::section_curvature_z:
    //  ksi = 6;
    //  break;
    default:
      ksi = -1;
      break;
  }
  if ( ksi >= 0 && ksi <= 3 && HasPrincipalCurvatures() ) {
    ON_Mesh* p = (ON_Mesh*)this; // const lie 
    if ( !m_kstat[ksi] ) {
      p->m_kstat[ksi] = new ON_MeshCurvatureStats();
      p->m_kstat[ksi]->Set( kappa_style, m_K.Count(), m_K.Array(), m_N.Array() );
    }
    if ( p->m_kstat[ksi] ) {
      stats = *p->m_kstat[ksi];
      rc = true;
    }
  }
  return rc;
}